

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slots.cpp
# Opt level: O2

void __thiscall MainWindow::openFile(MainWindow *this,QString *path)

{
  ModuleFile *this_00;
  int iVar1;
  FormatError FVar2;
  QArrayDataPointer<char16_t> local_60;
  QMessageBox msgbox;
  
  Renderer::forceStop(this->mRenderer);
  QCursor::QCursor((QCursor *)&msgbox,WaitCursor);
  QGuiApplication::setOverrideCursor((QCursor *)&msgbox);
  QCursor::~QCursor((QCursor *)&msgbox);
  this_00 = &this->mModuleFile;
  iVar1 = ModuleFile::open(this_00,(char *)path,(int)this->mModule);
  QGuiApplication::restoreOverrideCursor();
  if ((char)iVar1 == '\0') {
    QMessageBox::QMessageBox(&msgbox,(QWidget *)0x0);
    QMessageBox::setIcon((Icon)&msgbox);
    tr((QString *)&local_60,"Could not open module",(char *)0x0,-1);
    QMessageBox::setText((QString *)&msgbox);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    FVar2 = ModuleFile::lastError(this_00);
    switch(FVar2) {
    case invalidSignature:
      tr((QString *)&local_60,"The file is not a trackerboy module",(char *)0x0,-1);
      QMessageBox::setInformativeText((QString *)&msgbox);
      break;
    case invalidRevision:
      tr((QString *)&local_60,"The module is from a newer version of Trackerboy",(char *)0x0,-1);
      QMessageBox::setInformativeText((QString *)&msgbox);
      break;
    case cannotUpgrade:
      tr((QString *)&local_60,"Failed to upgrade the module",(char *)0x0,-1);
      QMessageBox::setInformativeText((QString *)&msgbox);
      break;
    case duplicateId:
    case invalid:
    case unknownChannel:
      tr((QString *)&local_60,"The module is corrupted",(char *)0x0,-1);
      QMessageBox::setInformativeText((QString *)&msgbox);
      break;
    default:
      tr((QString *)&local_60,"The file could not be read",(char *)0x0,-1);
      QMessageBox::setInformativeText((QString *)&msgbox);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    QDialog::exec();
    ModuleFile::setName(this_00,&this->mUntitledString);
    QMessageBox::~QMessageBox(&msgbox);
  }
  else {
    pushRecentFile(this,path);
  }
  updateWindowTitle(this);
  return;
}

Assistant:

void MainWindow::openFile(QString const& path) {
    mRenderer->forceStop();

    QApplication::setOverrideCursor(Qt::WaitCursor);
    bool opened = mModuleFile.open(path, *mModule);
    QApplication::restoreOverrideCursor();

    if (opened) {
        pushRecentFile(path);
    } else {
        QMessageBox msgbox;
        msgbox.setIcon(QMessageBox::Critical);
        msgbox.setText(tr("Could not open module"));

        auto error = mModuleFile.lastError();
        switch (error) {
            case trackerboy::FormatError::invalidSignature:
                msgbox.setInformativeText(tr("The file is not a trackerboy module"));
                break;
            case trackerboy::FormatError::invalidRevision:
                msgbox.setInformativeText(tr("The module is from a newer version of Trackerboy"));
                break;
            case trackerboy::FormatError::cannotUpgrade:
                msgbox.setInformativeText(tr("Failed to upgrade the module"));
                break;
            case trackerboy::FormatError::duplicateId:
            case trackerboy::FormatError::invalid:
            case trackerboy::FormatError::unknownChannel:
                msgbox.setInformativeText(tr("The module is corrupted"));
                break;
            default:
                msgbox.setInformativeText(tr("The file could not be read"));
                break;
        }


        msgbox.exec();
        mModuleFile.setName(mUntitledString);

    }

    // update window title with document name
    updateWindowTitle();
}